

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O2

void idct32_stage8_sse4_1
               (__m128i *bf1,__m128i *cospim32,__m128i *cospi32,__m128i *clamp_lo,__m128i *clamp_hi,
               __m128i *rounding,int bit)

{
  __m128i alVar1;
  __m128i alVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar17;
  int iVar19;
  int iVar20;
  int iVar21;
  undefined1 auVar18 [16];
  int iVar22;
  uint uVar23;
  int iVar25;
  uint uVar26;
  int iVar27;
  uint uVar28;
  int iVar29;
  uint uVar30;
  undefined1 auVar24 [16];
  int iVar31;
  int iVar34;
  int iVar36;
  __m128i y;
  uint uVar32;
  uint uVar35;
  uint uVar37;
  int iVar38;
  uint uVar39;
  undefined1 auVar33 [16];
  
  iVar8 = (int)bf1[0xf][0];
  iVar12 = *(int *)((long)bf1[0xf] + 4);
  iVar14 = (int)bf1[0xf][1];
  iVar16 = *(int *)((long)bf1[0xf] + 0xc);
  iVar22 = (int)(*bf1)[0];
  iVar25 = *(int *)((long)*bf1 + 4);
  iVar27 = (int)(*bf1)[1];
  iVar29 = *(int *)((long)*bf1 + 0xc);
  iVar17 = (int)bf1[1][0];
  iVar19 = *(int *)((long)bf1[1] + 4);
  iVar20 = (int)bf1[1][1];
  iVar21 = *(int *)((long)bf1[1] + 0xc);
  iVar7 = (int)bf1[2][0];
  iVar11 = *(int *)((long)bf1[2] + 4);
  iVar13 = (int)bf1[2][1];
  iVar15 = *(int *)((long)bf1[2] + 0xc);
  iVar3 = (int)bf1[0xd][0];
  iVar4 = *(int *)((long)bf1[0xd] + 4);
  iVar5 = (int)bf1[0xd][1];
  iVar6 = *(int *)((long)bf1[0xd] + 0xc);
  iVar31 = iVar8 + iVar22;
  iVar34 = iVar12 + iVar25;
  iVar36 = iVar14 + iVar27;
  iVar38 = iVar16 + iVar29;
  iVar22 = iVar22 - iVar8;
  iVar25 = iVar25 - iVar12;
  iVar27 = iVar27 - iVar14;
  iVar29 = iVar29 - iVar16;
  iVar8 = (int)(*clamp_lo)[0];
  iVar12 = *(int *)((long)*clamp_lo + 4);
  iVar14 = (int)(*clamp_lo)[1];
  iVar16 = *(int *)((long)*clamp_lo + 0xc);
  uVar32 = (uint)(iVar31 < iVar8) * iVar8 | (uint)(iVar31 >= iVar8) * iVar31;
  uVar35 = (uint)(iVar34 < iVar12) * iVar12 | (uint)(iVar34 >= iVar12) * iVar34;
  uVar37 = (uint)(iVar36 < iVar14) * iVar14 | (uint)(iVar36 >= iVar14) * iVar36;
  uVar39 = (uint)(iVar38 < iVar16) * iVar16 | (uint)(iVar38 >= iVar16) * iVar38;
  iVar31 = (int)(*clamp_hi)[0];
  iVar34 = *(int *)((long)*clamp_hi + 4);
  iVar36 = (int)(*clamp_hi)[1];
  iVar38 = *(int *)((long)*clamp_hi + 0xc);
  uVar23 = (uint)(iVar22 < iVar8) * iVar8 | (uint)(iVar22 >= iVar8) * iVar22;
  uVar26 = (uint)(iVar25 < iVar12) * iVar12 | (uint)(iVar25 >= iVar12) * iVar25;
  uVar28 = (uint)(iVar27 < iVar14) * iVar14 | (uint)(iVar27 >= iVar14) * iVar27;
  uVar30 = (uint)(iVar29 < iVar16) * iVar16 | (uint)(iVar29 >= iVar16) * iVar29;
  *(uint *)*bf1 = (uint)(iVar31 < (int)uVar32) * iVar31 | (iVar31 >= (int)uVar32) * uVar32;
  *(uint *)((long)*bf1 + 4) =
       (uint)(iVar34 < (int)uVar35) * iVar34 | (iVar34 >= (int)uVar35) * uVar35;
  *(uint *)(*bf1 + 1) = (uint)(iVar36 < (int)uVar37) * iVar36 | (iVar36 >= (int)uVar37) * uVar37;
  *(uint *)((long)*bf1 + 0xc) =
       (uint)(iVar38 < (int)uVar39) * iVar38 | (iVar38 >= (int)uVar39) * uVar39;
  *(uint *)bf1[0xf] = (uint)(iVar31 < (int)uVar23) * iVar31 | (iVar31 >= (int)uVar23) * uVar23;
  *(uint *)((long)bf1[0xf] + 4) =
       (uint)(iVar34 < (int)uVar26) * iVar34 | (iVar34 >= (int)uVar26) * uVar26;
  *(uint *)(bf1[0xf] + 1) = (uint)(iVar36 < (int)uVar28) * iVar36 | (iVar36 >= (int)uVar28) * uVar28
  ;
  *(uint *)((long)bf1[0xf] + 0xc) =
       (uint)(iVar38 < (int)uVar30) * iVar38 | (iVar38 >= (int)uVar30) * uVar30;
  iVar8 = (int)bf1[0xe][0];
  iVar12 = *(int *)((long)bf1[0xe] + 4);
  iVar14 = (int)bf1[0xe][1];
  iVar16 = *(int *)((long)bf1[0xe] + 0xc);
  iVar22 = iVar8 + iVar17;
  iVar25 = iVar12 + iVar19;
  iVar27 = iVar14 + iVar20;
  iVar29 = iVar16 + iVar21;
  iVar17 = iVar17 - iVar8;
  iVar19 = iVar19 - iVar12;
  iVar20 = iVar20 - iVar14;
  iVar21 = iVar21 - iVar16;
  iVar8 = (int)(*clamp_lo)[0];
  iVar12 = *(int *)((long)*clamp_lo + 4);
  iVar14 = (int)(*clamp_lo)[1];
  iVar16 = *(int *)((long)*clamp_lo + 0xc);
  uVar32 = (uint)(iVar22 < iVar8) * iVar8 | (uint)(iVar22 >= iVar8) * iVar22;
  uVar35 = (uint)(iVar25 < iVar12) * iVar12 | (uint)(iVar25 >= iVar12) * iVar25;
  uVar37 = (uint)(iVar27 < iVar14) * iVar14 | (uint)(iVar27 >= iVar14) * iVar27;
  uVar39 = (uint)(iVar29 < iVar16) * iVar16 | (uint)(iVar29 >= iVar16) * iVar29;
  iVar22 = (int)(*clamp_hi)[0];
  iVar25 = *(int *)((long)*clamp_hi + 4);
  iVar27 = (int)(*clamp_hi)[1];
  iVar29 = *(int *)((long)*clamp_hi + 0xc);
  uVar23 = (uint)(iVar17 < iVar8) * iVar8 | (uint)(iVar17 >= iVar8) * iVar17;
  uVar26 = (uint)(iVar19 < iVar12) * iVar12 | (uint)(iVar19 >= iVar12) * iVar19;
  uVar28 = (uint)(iVar20 < iVar14) * iVar14 | (uint)(iVar20 >= iVar14) * iVar20;
  uVar30 = (uint)(iVar21 < iVar16) * iVar16 | (uint)(iVar21 >= iVar16) * iVar21;
  *(uint *)bf1[1] = (uint)(iVar22 < (int)uVar32) * iVar22 | (iVar22 >= (int)uVar32) * uVar32;
  *(uint *)((long)bf1[1] + 4) =
       (uint)(iVar25 < (int)uVar35) * iVar25 | (iVar25 >= (int)uVar35) * uVar35;
  *(uint *)(bf1[1] + 1) = (uint)(iVar27 < (int)uVar37) * iVar27 | (iVar27 >= (int)uVar37) * uVar37;
  *(uint *)((long)bf1[1] + 0xc) =
       (uint)(iVar29 < (int)uVar39) * iVar29 | (iVar29 >= (int)uVar39) * uVar39;
  *(uint *)bf1[0xe] = (uint)(iVar22 < (int)uVar23) * iVar22 | (iVar22 >= (int)uVar23) * uVar23;
  *(uint *)((long)bf1[0xe] + 4) =
       (uint)(iVar25 < (int)uVar26) * iVar25 | (iVar25 >= (int)uVar26) * uVar26;
  *(uint *)(bf1[0xe] + 1) = (uint)(iVar27 < (int)uVar28) * iVar27 | (iVar27 >= (int)uVar28) * uVar28
  ;
  *(uint *)((long)bf1[0xe] + 0xc) =
       (uint)(iVar29 < (int)uVar30) * iVar29 | (iVar29 >= (int)uVar30) * uVar30;
  iVar22 = iVar3 + iVar7;
  iVar25 = iVar4 + iVar11;
  iVar27 = iVar5 + iVar13;
  iVar29 = iVar6 + iVar15;
  iVar7 = iVar7 - iVar3;
  iVar11 = iVar11 - iVar4;
  iVar13 = iVar13 - iVar5;
  iVar15 = iVar15 - iVar6;
  iVar8 = (int)(*clamp_lo)[0];
  iVar12 = *(int *)((long)*clamp_lo + 4);
  iVar14 = (int)(*clamp_lo)[1];
  iVar16 = *(int *)((long)*clamp_lo + 0xc);
  uVar32 = (uint)(iVar22 < iVar8) * iVar8 | (uint)(iVar22 >= iVar8) * iVar22;
  uVar35 = (uint)(iVar25 < iVar12) * iVar12 | (uint)(iVar25 >= iVar12) * iVar25;
  uVar37 = (uint)(iVar27 < iVar14) * iVar14 | (uint)(iVar27 >= iVar14) * iVar27;
  uVar39 = (uint)(iVar29 < iVar16) * iVar16 | (uint)(iVar29 >= iVar16) * iVar29;
  iVar22 = (int)(*clamp_hi)[0];
  iVar25 = *(int *)((long)*clamp_hi + 4);
  iVar27 = (int)(*clamp_hi)[1];
  iVar29 = *(int *)((long)*clamp_hi + 0xc);
  uVar23 = (uint)(iVar7 < iVar8) * iVar8 | (uint)(iVar7 >= iVar8) * iVar7;
  uVar26 = (uint)(iVar11 < iVar12) * iVar12 | (uint)(iVar11 >= iVar12) * iVar11;
  uVar28 = (uint)(iVar13 < iVar14) * iVar14 | (uint)(iVar13 >= iVar14) * iVar13;
  uVar30 = (uint)(iVar15 < iVar16) * iVar16 | (uint)(iVar15 >= iVar16) * iVar15;
  *(uint *)bf1[2] = (uint)(iVar22 < (int)uVar32) * iVar22 | (iVar22 >= (int)uVar32) * uVar32;
  *(uint *)((long)bf1[2] + 4) =
       (uint)(iVar25 < (int)uVar35) * iVar25 | (iVar25 >= (int)uVar35) * uVar35;
  *(uint *)(bf1[2] + 1) = (uint)(iVar27 < (int)uVar37) * iVar27 | (iVar27 >= (int)uVar37) * uVar37;
  *(uint *)((long)bf1[2] + 0xc) =
       (uint)(iVar29 < (int)uVar39) * iVar29 | (iVar29 >= (int)uVar39) * uVar39;
  *(uint *)bf1[0xd] = (uint)(iVar22 < (int)uVar23) * iVar22 | (iVar22 >= (int)uVar23) * uVar23;
  *(uint *)((long)bf1[0xd] + 4) =
       (uint)(iVar25 < (int)uVar26) * iVar25 | (iVar25 >= (int)uVar26) * uVar26;
  *(uint *)(bf1[0xd] + 1) = (uint)(iVar27 < (int)uVar28) * iVar27 | (iVar27 >= (int)uVar28) * uVar28
  ;
  *(uint *)((long)bf1[0xd] + 0xc) =
       (uint)(iVar29 < (int)uVar30) * iVar29 | (iVar29 >= (int)uVar30) * uVar30;
  iVar8 = (int)bf1[3][0];
  iVar12 = *(int *)((long)bf1[3] + 4);
  iVar14 = (int)bf1[3][1];
  iVar16 = *(int *)((long)bf1[3] + 0xc);
  iVar22 = (int)bf1[0xc][0];
  iVar25 = *(int *)((long)bf1[0xc] + 4);
  iVar27 = (int)bf1[0xc][1];
  iVar29 = *(int *)((long)bf1[0xc] + 0xc);
  iVar17 = iVar22 + iVar8;
  iVar19 = iVar25 + iVar12;
  iVar20 = iVar27 + iVar14;
  iVar21 = iVar29 + iVar16;
  iVar8 = iVar8 - iVar22;
  iVar12 = iVar12 - iVar25;
  iVar14 = iVar14 - iVar27;
  iVar16 = iVar16 - iVar29;
  iVar22 = (int)(*clamp_lo)[0];
  iVar25 = *(int *)((long)*clamp_lo + 4);
  iVar27 = (int)(*clamp_lo)[1];
  iVar29 = *(int *)((long)*clamp_lo + 0xc);
  uVar32 = (uint)(iVar17 < iVar22) * iVar22 | (uint)(iVar17 >= iVar22) * iVar17;
  uVar35 = (uint)(iVar19 < iVar25) * iVar25 | (uint)(iVar19 >= iVar25) * iVar19;
  uVar37 = (uint)(iVar20 < iVar27) * iVar27 | (uint)(iVar20 >= iVar27) * iVar20;
  uVar39 = (uint)(iVar21 < iVar29) * iVar29 | (uint)(iVar21 >= iVar29) * iVar21;
  iVar17 = (int)(*clamp_hi)[0];
  iVar19 = *(int *)((long)*clamp_hi + 4);
  iVar20 = (int)(*clamp_hi)[1];
  iVar21 = *(int *)((long)*clamp_hi + 0xc);
  uVar23 = (uint)(iVar8 < iVar22) * iVar22 | (uint)(iVar8 >= iVar22) * iVar8;
  uVar26 = (uint)(iVar12 < iVar25) * iVar25 | (uint)(iVar12 >= iVar25) * iVar12;
  uVar28 = (uint)(iVar14 < iVar27) * iVar27 | (uint)(iVar14 >= iVar27) * iVar14;
  uVar30 = (uint)(iVar16 < iVar29) * iVar29 | (uint)(iVar16 >= iVar29) * iVar16;
  *(uint *)bf1[3] = (uint)(iVar17 < (int)uVar32) * iVar17 | (iVar17 >= (int)uVar32) * uVar32;
  *(uint *)((long)bf1[3] + 4) =
       (uint)(iVar19 < (int)uVar35) * iVar19 | (iVar19 >= (int)uVar35) * uVar35;
  *(uint *)(bf1[3] + 1) = (uint)(iVar20 < (int)uVar37) * iVar20 | (iVar20 >= (int)uVar37) * uVar37;
  *(uint *)((long)bf1[3] + 0xc) =
       (uint)(iVar21 < (int)uVar39) * iVar21 | (iVar21 >= (int)uVar39) * uVar39;
  *(uint *)bf1[0xc] = (uint)(iVar17 < (int)uVar23) * iVar17 | (iVar17 >= (int)uVar23) * uVar23;
  *(uint *)((long)bf1[0xc] + 4) =
       (uint)(iVar19 < (int)uVar26) * iVar19 | (iVar19 >= (int)uVar26) * uVar26;
  *(uint *)(bf1[0xc] + 1) = (uint)(iVar20 < (int)uVar28) * iVar20 | (iVar20 >= (int)uVar28) * uVar28
  ;
  *(uint *)((long)bf1[0xc] + 0xc) =
       (uint)(iVar21 < (int)uVar30) * iVar21 | (iVar21 >= (int)uVar30) * uVar30;
  iVar8 = (int)bf1[4][0];
  iVar12 = *(int *)((long)bf1[4] + 4);
  iVar14 = (int)bf1[4][1];
  iVar16 = *(int *)((long)bf1[4] + 0xc);
  iVar22 = (int)bf1[0xb][0];
  iVar25 = *(int *)((long)bf1[0xb] + 4);
  iVar27 = (int)bf1[0xb][1];
  iVar29 = *(int *)((long)bf1[0xb] + 0xc);
  iVar17 = iVar22 + iVar8;
  iVar19 = iVar25 + iVar12;
  iVar20 = iVar27 + iVar14;
  iVar21 = iVar29 + iVar16;
  iVar8 = iVar8 - iVar22;
  iVar12 = iVar12 - iVar25;
  iVar14 = iVar14 - iVar27;
  iVar16 = iVar16 - iVar29;
  iVar22 = (int)(*clamp_lo)[0];
  iVar25 = *(int *)((long)*clamp_lo + 4);
  iVar27 = (int)(*clamp_lo)[1];
  iVar29 = *(int *)((long)*clamp_lo + 0xc);
  uVar32 = (uint)(iVar17 < iVar22) * iVar22 | (uint)(iVar17 >= iVar22) * iVar17;
  uVar35 = (uint)(iVar19 < iVar25) * iVar25 | (uint)(iVar19 >= iVar25) * iVar19;
  uVar37 = (uint)(iVar20 < iVar27) * iVar27 | (uint)(iVar20 >= iVar27) * iVar20;
  uVar39 = (uint)(iVar21 < iVar29) * iVar29 | (uint)(iVar21 >= iVar29) * iVar21;
  iVar17 = (int)(*clamp_hi)[0];
  iVar19 = *(int *)((long)*clamp_hi + 4);
  iVar20 = (int)(*clamp_hi)[1];
  iVar21 = *(int *)((long)*clamp_hi + 0xc);
  uVar23 = (uint)(iVar8 < iVar22) * iVar22 | (uint)(iVar8 >= iVar22) * iVar8;
  uVar26 = (uint)(iVar12 < iVar25) * iVar25 | (uint)(iVar12 >= iVar25) * iVar12;
  uVar28 = (uint)(iVar14 < iVar27) * iVar27 | (uint)(iVar14 >= iVar27) * iVar14;
  uVar30 = (uint)(iVar16 < iVar29) * iVar29 | (uint)(iVar16 >= iVar29) * iVar16;
  *(uint *)bf1[4] = (uint)(iVar17 < (int)uVar32) * iVar17 | (iVar17 >= (int)uVar32) * uVar32;
  *(uint *)((long)bf1[4] + 4) =
       (uint)(iVar19 < (int)uVar35) * iVar19 | (iVar19 >= (int)uVar35) * uVar35;
  *(uint *)(bf1[4] + 1) = (uint)(iVar20 < (int)uVar37) * iVar20 | (iVar20 >= (int)uVar37) * uVar37;
  *(uint *)((long)bf1[4] + 0xc) =
       (uint)(iVar21 < (int)uVar39) * iVar21 | (iVar21 >= (int)uVar39) * uVar39;
  *(uint *)bf1[0xb] = (uint)(iVar17 < (int)uVar23) * iVar17 | (iVar17 >= (int)uVar23) * uVar23;
  *(uint *)((long)bf1[0xb] + 4) =
       (uint)(iVar19 < (int)uVar26) * iVar19 | (iVar19 >= (int)uVar26) * uVar26;
  *(uint *)(bf1[0xb] + 1) = (uint)(iVar20 < (int)uVar28) * iVar20 | (iVar20 >= (int)uVar28) * uVar28
  ;
  *(uint *)((long)bf1[0xb] + 0xc) =
       (uint)(iVar21 < (int)uVar30) * iVar21 | (iVar21 >= (int)uVar30) * uVar30;
  iVar8 = (int)bf1[5][0];
  iVar12 = *(int *)((long)bf1[5] + 4);
  iVar14 = (int)bf1[5][1];
  iVar16 = *(int *)((long)bf1[5] + 0xc);
  iVar22 = (int)bf1[10][0];
  iVar25 = *(int *)((long)bf1[10] + 4);
  iVar27 = (int)bf1[10][1];
  iVar29 = *(int *)((long)bf1[10] + 0xc);
  iVar17 = iVar22 + iVar8;
  iVar19 = iVar25 + iVar12;
  iVar20 = iVar27 + iVar14;
  iVar21 = iVar29 + iVar16;
  iVar8 = iVar8 - iVar22;
  iVar12 = iVar12 - iVar25;
  iVar14 = iVar14 - iVar27;
  iVar16 = iVar16 - iVar29;
  iVar22 = (int)(*clamp_lo)[0];
  iVar25 = *(int *)((long)*clamp_lo + 4);
  iVar27 = (int)(*clamp_lo)[1];
  iVar29 = *(int *)((long)*clamp_lo + 0xc);
  uVar32 = (uint)(iVar17 < iVar22) * iVar22 | (uint)(iVar17 >= iVar22) * iVar17;
  uVar35 = (uint)(iVar19 < iVar25) * iVar25 | (uint)(iVar19 >= iVar25) * iVar19;
  uVar37 = (uint)(iVar20 < iVar27) * iVar27 | (uint)(iVar20 >= iVar27) * iVar20;
  uVar39 = (uint)(iVar21 < iVar29) * iVar29 | (uint)(iVar21 >= iVar29) * iVar21;
  iVar17 = (int)(*clamp_hi)[0];
  iVar19 = *(int *)((long)*clamp_hi + 4);
  iVar20 = (int)(*clamp_hi)[1];
  iVar21 = *(int *)((long)*clamp_hi + 0xc);
  uVar23 = (uint)(iVar8 < iVar22) * iVar22 | (uint)(iVar8 >= iVar22) * iVar8;
  uVar26 = (uint)(iVar12 < iVar25) * iVar25 | (uint)(iVar12 >= iVar25) * iVar12;
  uVar28 = (uint)(iVar14 < iVar27) * iVar27 | (uint)(iVar14 >= iVar27) * iVar14;
  uVar30 = (uint)(iVar16 < iVar29) * iVar29 | (uint)(iVar16 >= iVar29) * iVar16;
  *(uint *)bf1[5] = (uint)(iVar17 < (int)uVar32) * iVar17 | (iVar17 >= (int)uVar32) * uVar32;
  *(uint *)((long)bf1[5] + 4) =
       (uint)(iVar19 < (int)uVar35) * iVar19 | (iVar19 >= (int)uVar35) * uVar35;
  *(uint *)(bf1[5] + 1) = (uint)(iVar20 < (int)uVar37) * iVar20 | (iVar20 >= (int)uVar37) * uVar37;
  *(uint *)((long)bf1[5] + 0xc) =
       (uint)(iVar21 < (int)uVar39) * iVar21 | (iVar21 >= (int)uVar39) * uVar39;
  *(uint *)bf1[10] = (uint)(iVar17 < (int)uVar23) * iVar17 | (iVar17 >= (int)uVar23) * uVar23;
  *(uint *)((long)bf1[10] + 4) =
       (uint)(iVar19 < (int)uVar26) * iVar19 | (iVar19 >= (int)uVar26) * uVar26;
  *(uint *)(bf1[10] + 1) = (uint)(iVar20 < (int)uVar28) * iVar20 | (iVar20 >= (int)uVar28) * uVar28;
  *(uint *)((long)bf1[10] + 0xc) =
       (uint)(iVar21 < (int)uVar30) * iVar21 | (iVar21 >= (int)uVar30) * uVar30;
  iVar8 = (int)bf1[6][0];
  iVar12 = *(int *)((long)bf1[6] + 4);
  iVar14 = (int)bf1[6][1];
  iVar16 = *(int *)((long)bf1[6] + 0xc);
  iVar22 = (int)bf1[9][0];
  iVar25 = *(int *)((long)bf1[9] + 4);
  iVar27 = (int)bf1[9][1];
  iVar29 = *(int *)((long)bf1[9] + 0xc);
  iVar17 = iVar22 + iVar8;
  iVar19 = iVar25 + iVar12;
  iVar20 = iVar27 + iVar14;
  iVar21 = iVar29 + iVar16;
  iVar8 = iVar8 - iVar22;
  iVar12 = iVar12 - iVar25;
  iVar14 = iVar14 - iVar27;
  iVar16 = iVar16 - iVar29;
  iVar22 = (int)(*clamp_lo)[0];
  iVar25 = *(int *)((long)*clamp_lo + 4);
  iVar27 = (int)(*clamp_lo)[1];
  iVar29 = *(int *)((long)*clamp_lo + 0xc);
  uVar32 = (uint)(iVar17 < iVar22) * iVar22 | (uint)(iVar17 >= iVar22) * iVar17;
  uVar35 = (uint)(iVar19 < iVar25) * iVar25 | (uint)(iVar19 >= iVar25) * iVar19;
  uVar37 = (uint)(iVar20 < iVar27) * iVar27 | (uint)(iVar20 >= iVar27) * iVar20;
  uVar39 = (uint)(iVar21 < iVar29) * iVar29 | (uint)(iVar21 >= iVar29) * iVar21;
  iVar17 = (int)(*clamp_hi)[0];
  iVar19 = *(int *)((long)*clamp_hi + 4);
  iVar20 = (int)(*clamp_hi)[1];
  iVar21 = *(int *)((long)*clamp_hi + 0xc);
  uVar23 = (uint)(iVar8 < iVar22) * iVar22 | (uint)(iVar8 >= iVar22) * iVar8;
  uVar26 = (uint)(iVar12 < iVar25) * iVar25 | (uint)(iVar12 >= iVar25) * iVar12;
  uVar28 = (uint)(iVar14 < iVar27) * iVar27 | (uint)(iVar14 >= iVar27) * iVar14;
  uVar30 = (uint)(iVar16 < iVar29) * iVar29 | (uint)(iVar16 >= iVar29) * iVar16;
  *(uint *)bf1[6] = (uint)(iVar17 < (int)uVar32) * iVar17 | (iVar17 >= (int)uVar32) * uVar32;
  *(uint *)((long)bf1[6] + 4) =
       (uint)(iVar19 < (int)uVar35) * iVar19 | (iVar19 >= (int)uVar35) * uVar35;
  *(uint *)(bf1[6] + 1) = (uint)(iVar20 < (int)uVar37) * iVar20 | (iVar20 >= (int)uVar37) * uVar37;
  *(uint *)((long)bf1[6] + 0xc) =
       (uint)(iVar21 < (int)uVar39) * iVar21 | (iVar21 >= (int)uVar39) * uVar39;
  *(uint *)bf1[9] = (uint)(iVar17 < (int)uVar23) * iVar17 | (iVar17 >= (int)uVar23) * uVar23;
  *(uint *)((long)bf1[9] + 4) =
       (uint)(iVar19 < (int)uVar26) * iVar19 | (iVar19 >= (int)uVar26) * uVar26;
  *(uint *)(bf1[9] + 1) = (uint)(iVar20 < (int)uVar28) * iVar20 | (iVar20 >= (int)uVar28) * uVar28;
  *(uint *)((long)bf1[9] + 0xc) =
       (uint)(iVar21 < (int)uVar30) * iVar21 | (iVar21 >= (int)uVar30) * uVar30;
  iVar8 = (int)bf1[7][0];
  iVar12 = *(int *)((long)bf1[7] + 4);
  iVar14 = (int)bf1[7][1];
  iVar16 = *(int *)((long)bf1[7] + 0xc);
  iVar22 = (int)bf1[8][0];
  iVar25 = *(int *)((long)bf1[8] + 4);
  iVar27 = (int)bf1[8][1];
  iVar29 = *(int *)((long)bf1[8] + 0xc);
  iVar17 = iVar22 + iVar8;
  iVar19 = iVar25 + iVar12;
  iVar20 = iVar27 + iVar14;
  iVar21 = iVar29 + iVar16;
  iVar8 = iVar8 - iVar22;
  iVar12 = iVar12 - iVar25;
  iVar14 = iVar14 - iVar27;
  iVar16 = iVar16 - iVar29;
  iVar22 = (int)(*clamp_lo)[0];
  iVar25 = *(int *)((long)*clamp_lo + 4);
  iVar27 = (int)(*clamp_lo)[1];
  iVar29 = *(int *)((long)*clamp_lo + 0xc);
  uVar32 = (uint)(iVar17 < iVar22) * iVar22 | (uint)(iVar17 >= iVar22) * iVar17;
  uVar35 = (uint)(iVar19 < iVar25) * iVar25 | (uint)(iVar19 >= iVar25) * iVar19;
  uVar37 = (uint)(iVar20 < iVar27) * iVar27 | (uint)(iVar20 >= iVar27) * iVar20;
  uVar39 = (uint)(iVar21 < iVar29) * iVar29 | (uint)(iVar21 >= iVar29) * iVar21;
  iVar17 = (int)(*clamp_hi)[0];
  iVar19 = *(int *)((long)*clamp_hi + 4);
  iVar20 = (int)(*clamp_hi)[1];
  iVar21 = *(int *)((long)*clamp_hi + 0xc);
  uVar23 = (uint)(iVar8 < iVar22) * iVar22 | (uint)(iVar8 >= iVar22) * iVar8;
  uVar26 = (uint)(iVar12 < iVar25) * iVar25 | (uint)(iVar12 >= iVar25) * iVar12;
  uVar28 = (uint)(iVar14 < iVar27) * iVar27 | (uint)(iVar14 >= iVar27) * iVar14;
  uVar30 = (uint)(iVar16 < iVar29) * iVar29 | (uint)(iVar16 >= iVar29) * iVar16;
  *(uint *)bf1[7] = (uint)(iVar17 < (int)uVar32) * iVar17 | (iVar17 >= (int)uVar32) * uVar32;
  *(uint *)((long)bf1[7] + 4) =
       (uint)(iVar19 < (int)uVar35) * iVar19 | (iVar19 >= (int)uVar35) * uVar35;
  *(uint *)(bf1[7] + 1) = (uint)(iVar20 < (int)uVar37) * iVar20 | (iVar20 >= (int)uVar37) * uVar37;
  *(uint *)((long)bf1[7] + 0xc) =
       (uint)(iVar21 < (int)uVar39) * iVar21 | (iVar21 >= (int)uVar39) * uVar39;
  *(uint *)bf1[8] = (uint)(iVar17 < (int)uVar23) * iVar17 | (iVar17 >= (int)uVar23) * uVar23;
  *(uint *)((long)bf1[8] + 4) =
       (uint)(iVar19 < (int)uVar26) * iVar19 | (iVar19 >= (int)uVar26) * uVar26;
  *(uint *)(bf1[8] + 1) = (uint)(iVar20 < (int)uVar28) * iVar20 | (iVar20 >= (int)uVar28) * uVar28;
  *(uint *)((long)bf1[8] + 0xc) =
       (uint)(iVar21 < (int)uVar30) * iVar21 | (iVar21 >= (int)uVar30) * uVar30;
  alVar1 = bf1[0x14];
  alVar2 = bf1[0x1b];
  auVar9 = pmulld((undefined1  [16])*cospim32,(undefined1  [16])alVar1);
  auVar24 = pmulld((undefined1  [16])alVar2,(undefined1  [16])*cospi32);
  iVar8 = (int)(*rounding)[0];
  iVar12 = *(int *)((long)*rounding + 4);
  iVar14 = (int)(*rounding)[1];
  iVar16 = *(int *)((long)*rounding + 0xc);
  auVar10 = ZEXT416((uint)bit);
  auVar18._0_4_ = (int)alVar2[0] + (int)alVar1[0];
  auVar18._4_4_ = alVar2[0]._4_4_ + alVar1[0]._4_4_;
  auVar18._8_4_ = (int)alVar2[1] + (int)alVar1[1];
  auVar18._12_4_ = alVar2[1]._4_4_ + alVar1[1]._4_4_;
  auVar18 = pmulld(auVar18,(undefined1  [16])*cospi32);
  *(int *)bf1[0x1b] = auVar18._0_4_ + iVar8 >> auVar10;
  *(int *)((long)bf1[0x1b] + 4) = auVar18._4_4_ + iVar12 >> auVar10;
  *(int *)(bf1[0x1b] + 1) = auVar18._8_4_ + iVar14 >> auVar10;
  *(int *)((long)bf1[0x1b] + 0xc) = auVar18._12_4_ + iVar16 >> auVar10;
  *(int *)bf1[0x14] = auVar24._0_4_ + auVar9._0_4_ + iVar8 >> auVar10;
  *(int *)((long)bf1[0x14] + 4) = auVar24._4_4_ + auVar9._4_4_ + iVar12 >> auVar10;
  *(int *)(bf1[0x14] + 1) = auVar24._8_4_ + auVar9._8_4_ + iVar14 >> auVar10;
  *(int *)((long)bf1[0x14] + 0xc) = auVar24._12_4_ + auVar9._12_4_ + iVar16 >> auVar10;
  alVar1 = bf1[0x15];
  alVar2 = bf1[0x1a];
  auVar18 = pmulld((undefined1  [16])*cospim32,(undefined1  [16])alVar1);
  auVar24 = pmulld((undefined1  [16])alVar2,(undefined1  [16])*cospi32);
  iVar8 = (int)(*rounding)[0];
  iVar12 = *(int *)((long)*rounding + 4);
  iVar14 = (int)(*rounding)[1];
  iVar16 = *(int *)((long)*rounding + 0xc);
  auVar9._0_4_ = (int)alVar2[0] + (int)alVar1[0];
  auVar9._4_4_ = alVar2[0]._4_4_ + alVar1[0]._4_4_;
  auVar9._8_4_ = (int)alVar2[1] + (int)alVar1[1];
  auVar9._12_4_ = alVar2[1]._4_4_ + alVar1[1]._4_4_;
  auVar9 = pmulld(auVar9,(undefined1  [16])*cospi32);
  *(int *)bf1[0x1a] = auVar9._0_4_ + iVar8 >> auVar10;
  *(int *)((long)bf1[0x1a] + 4) = auVar9._4_4_ + iVar12 >> auVar10;
  *(int *)(bf1[0x1a] + 1) = auVar9._8_4_ + iVar14 >> auVar10;
  *(int *)((long)bf1[0x1a] + 0xc) = auVar9._12_4_ + iVar16 >> auVar10;
  *(int *)bf1[0x15] = auVar24._0_4_ + auVar18._0_4_ + iVar8 >> auVar10;
  *(int *)((long)bf1[0x15] + 4) = auVar24._4_4_ + auVar18._4_4_ + iVar12 >> auVar10;
  *(int *)(bf1[0x15] + 1) = auVar24._8_4_ + auVar18._8_4_ + iVar14 >> auVar10;
  *(int *)((long)bf1[0x15] + 0xc) = auVar24._12_4_ + auVar18._12_4_ + iVar16 >> auVar10;
  alVar1 = bf1[0x16];
  alVar2 = bf1[0x19];
  auVar18 = pmulld((undefined1  [16])*cospim32,(undefined1  [16])alVar1);
  auVar33 = pmulld((undefined1  [16])alVar2,(undefined1  [16])*cospi32);
  iVar8 = (int)(*rounding)[0];
  iVar12 = *(int *)((long)*rounding + 4);
  iVar14 = (int)(*rounding)[1];
  iVar16 = *(int *)((long)*rounding + 0xc);
  auVar24._0_4_ = (int)alVar2[0] + (int)alVar1[0];
  auVar24._4_4_ = alVar2[0]._4_4_ + alVar1[0]._4_4_;
  auVar24._8_4_ = (int)alVar2[1] + (int)alVar1[1];
  auVar24._12_4_ = alVar2[1]._4_4_ + alVar1[1]._4_4_;
  auVar9 = pmulld(auVar24,(undefined1  [16])*cospi32);
  *(int *)bf1[0x19] = auVar9._0_4_ + iVar8 >> auVar10;
  *(int *)((long)bf1[0x19] + 4) = auVar9._4_4_ + iVar12 >> auVar10;
  *(int *)(bf1[0x19] + 1) = auVar9._8_4_ + iVar14 >> auVar10;
  *(int *)((long)bf1[0x19] + 0xc) = auVar9._12_4_ + iVar16 >> auVar10;
  *(int *)bf1[0x16] = auVar33._0_4_ + auVar18._0_4_ + iVar8 >> auVar10;
  *(int *)((long)bf1[0x16] + 4) = auVar33._4_4_ + auVar18._4_4_ + iVar12 >> auVar10;
  *(int *)(bf1[0x16] + 1) = auVar33._8_4_ + auVar18._8_4_ + iVar14 >> auVar10;
  *(int *)((long)bf1[0x16] + 0xc) = auVar33._12_4_ + auVar18._12_4_ + iVar16 >> auVar10;
  alVar1 = bf1[0x17];
  alVar2 = bf1[0x18];
  auVar18 = pmulld((undefined1  [16])*cospim32,(undefined1  [16])alVar1);
  auVar24 = pmulld((undefined1  [16])alVar2,(undefined1  [16])*cospi32);
  iVar8 = (int)(*rounding)[0];
  iVar12 = *(int *)((long)*rounding + 4);
  iVar14 = (int)(*rounding)[1];
  iVar16 = *(int *)((long)*rounding + 0xc);
  auVar33._0_4_ = (int)alVar2[0] + (int)alVar1[0];
  auVar33._4_4_ = alVar2[0]._4_4_ + alVar1[0]._4_4_;
  auVar33._8_4_ = (int)alVar2[1] + (int)alVar1[1];
  auVar33._12_4_ = alVar2[1]._4_4_ + alVar1[1]._4_4_;
  auVar9 = pmulld(auVar33,(undefined1  [16])*cospi32);
  *(int *)bf1[0x18] = auVar9._0_4_ + iVar8 >> auVar10;
  *(int *)((long)bf1[0x18] + 4) = auVar9._4_4_ + iVar12 >> auVar10;
  *(int *)(bf1[0x18] + 1) = auVar9._8_4_ + iVar14 >> auVar10;
  *(int *)((long)bf1[0x18] + 0xc) = auVar9._12_4_ + iVar16 >> auVar10;
  *(int *)bf1[0x17] = auVar24._0_4_ + auVar18._0_4_ + iVar8 >> auVar10;
  *(int *)((long)bf1[0x17] + 4) = auVar24._4_4_ + auVar18._4_4_ + iVar12 >> auVar10;
  *(int *)(bf1[0x17] + 1) = auVar24._8_4_ + auVar18._8_4_ + iVar14 >> auVar10;
  *(int *)((long)bf1[0x17] + 0xc) = auVar24._12_4_ + auVar18._12_4_ + iVar16 >> auVar10;
  return;
}

Assistant:

static inline void idct32_stage8_sse4_1(__m128i *bf1, const __m128i *cospim32,
                                        const __m128i *cospi32,
                                        const __m128i *clamp_lo,
                                        const __m128i *clamp_hi,
                                        const __m128i *rounding, int bit) {
  __m128i temp1, temp2;
  addsub_sse4_1(bf1[0], bf1[15], bf1 + 0, bf1 + 15, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[1], bf1[14], bf1 + 1, bf1 + 14, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[2], bf1[13], bf1 + 2, bf1 + 13, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[3], bf1[12], bf1 + 3, bf1 + 12, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[4], bf1[11], bf1 + 4, bf1 + 11, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[5], bf1[10], bf1 + 5, bf1 + 10, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[6], bf1[9], bf1 + 6, bf1 + 9, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[7], bf1[8], bf1 + 7, bf1 + 8, clamp_lo, clamp_hi);

  temp1 = half_btf_sse4_1(cospim32, &bf1[20], cospi32, &bf1[27], rounding, bit);
  bf1[27] =
      half_btf_sse4_1(cospi32, &bf1[20], cospi32, &bf1[27], rounding, bit);
  bf1[20] = temp1;
  temp2 = half_btf_sse4_1(cospim32, &bf1[21], cospi32, &bf1[26], rounding, bit);
  bf1[26] =
      half_btf_sse4_1(cospi32, &bf1[21], cospi32, &bf1[26], rounding, bit);
  bf1[21] = temp2;
  temp1 = half_btf_sse4_1(cospim32, &bf1[22], cospi32, &bf1[25], rounding, bit);
  bf1[25] =
      half_btf_sse4_1(cospi32, &bf1[22], cospi32, &bf1[25], rounding, bit);
  bf1[22] = temp1;
  temp2 = half_btf_sse4_1(cospim32, &bf1[23], cospi32, &bf1[24], rounding, bit);
  bf1[24] =
      half_btf_sse4_1(cospi32, &bf1[23], cospi32, &bf1[24], rounding, bit);
  bf1[23] = temp2;
}